

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O0

int mp_check_ext_data_test(int8_t type,char *data,uint32_t len)

{
  uint local_20;
  uint32_t i;
  uint32_t len_local;
  char *data_local;
  int8_t type_local;
  
  if (type == 'B') {
    for (local_20 = 0; local_20 < len; local_20 = local_20 + 1) {
      if ((uint)(byte)data[local_20] != len - local_20) {
        return 1;
      }
    }
    data_local._4_4_ = 0;
  }
  else {
    data_local._4_4_ = 1;
  }
  return data_local._4_4_;
}

Assistant:

int
mp_check_ext_data_test(int8_t type, const char *data, uint32_t len)
{
	if (type != 0x42)
		return 1;
	for (uint32_t i = 0; i < len; i++) {
		if ((unsigned char)data[i] != len - i)
			return 1;
	}
	return 0;
}